

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

__pid_t __thiscall
kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>_>::wait
          (Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>_>
           *this,void *__stat_loc)

{
  SourceLocation location;
  WaitScope *in_RDX;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMembrane::WaitForeverResults>_>
  result;
  ExceptionOrValue local_1e8;
  char local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  PromiseNode *local_18;
  PromiseNode *local_10;
  
  local_1e8.exception.ptr.isSet = false;
  local_50 = '\0';
  location.function = (char *)in_stack_00000010;
  location.fileName = (char *)in_stack_00000008;
  location._16_8_ = in_stack_00000018;
  kj::_::waitImpl((OwnPromiseNode *)__stat_loc,&local_1e8,in_RDX,location);
  if (local_50 == '\x01') {
    if (local_1e8.exception.ptr.isSet != false) {
      throwRecoverableException(&local_1e8.exception.ptr.field_1.value,0);
    }
    *(undefined4 *)&this[4].super_PromiseBase.node.ptr = local_28;
    *(undefined4 *)((long)&this[4].super_PromiseBase.node.ptr + 4) = uStack_24;
    *(undefined4 *)&this[5].super_PromiseBase.node.ptr = uStack_20;
    *(undefined4 *)((long)&this[5].super_PromiseBase.node.ptr + 4) = uStack_1c;
    *(undefined4 *)&this[2].super_PromiseBase.node.ptr = local_38;
    *(undefined4 *)((long)&this[2].super_PromiseBase.node.ptr + 4) = uStack_34;
    *(undefined4 *)&this[3].super_PromiseBase.node.ptr = uStack_30;
    *(undefined4 *)((long)&this[3].super_PromiseBase.node.ptr + 4) = uStack_2c;
    *(undefined4 *)&(this->super_PromiseBase).node.ptr = local_48;
    *(undefined4 *)((long)&(this->super_PromiseBase).node.ptr + 4) = uStack_44;
    *(undefined4 *)&this[1].super_PromiseBase.node.ptr = uStack_40;
    *(undefined4 *)((long)&this[1].super_PromiseBase.node.ptr + 4) = uStack_3c;
    this[6].super_PromiseBase.node.ptr = local_18;
    this[7].super_PromiseBase.node.ptr = local_10;
    local_10 = (PromiseNode *)0x0;
    if (local_1e8.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1e8.exception.ptr.field_1.value);
    }
    return (__pid_t)this;
  }
  if (local_1e8.exception.ptr.isSet == false) {
    kj::_::unreachable();
  }
  throwFatalException(&local_1e8.exception.ptr.field_1.value,0);
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope, SourceLocation location) {
  _::ExceptionOr<_::FixVoid<T>> result;
  _::waitImpl(kj::mv(node), result, waitScope, location);
  return convertToReturn(kj::mv(result));
}